

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkDirectoriesCommand.cxx
# Opt level: O0

void __thiscall
cmLinkDirectoriesCommand::AddLinkDir
          (cmLinkDirectoriesCommand *this,string *dir,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *directories)

{
  cmMakefile *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  ostream *poVar4;
  string *psVar5;
  PolicyID id;
  string local_268 [8];
  string tmp;
  string local_228;
  string local_208;
  string local_1e8;
  undefined1 local_1c8 [8];
  ostringstream e;
  bool convertToAbsolute;
  undefined1 local_40 [8];
  string unixPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *directories_local;
  string *dir_local;
  cmLinkDirectoriesCommand *this_local;
  
  unixPath.field_2._8_8_ = directories;
  std::__cxx11::string::string((string *)local_40,(string *)dir);
  cmsys::SystemTools::ConvertToUnixSlashes((string *)local_40);
  bVar2 = cmsys::SystemTools::FileIsFullPath((string *)local_40);
  if ((!bVar2) &&
     (bVar2 = cmGeneratorExpression::StartsWithGeneratorExpression((string *)local_40), !bVar2)) {
    bVar2 = false;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    poVar4 = std::operator<<((ostream *)local_1c8,"This command specifies the relative path\n");
    poVar4 = std::operator<<(poVar4,"  ");
    poVar4 = std::operator<<(poVar4,(string *)local_40);
    poVar4 = std::operator<<(poVar4,"\n");
    std::operator<<(poVar4,"as a link directory.\n");
    PVar3 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0015,false);
    switch(PVar3) {
    case OLD:
      break;
    case WARN:
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e8,(cmPolicies *)0xf,id);
      std::operator<<((ostream *)local_1c8,(string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      break;
    case REQUIRED_IF_USED:
    case REQUIRED_ALWAYS:
      cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_228,(cmPolicies *)0xf,id);
      std::operator<<((ostream *)local_1c8,(string *)&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)((long)&tmp.field_2 + 8));
      std::__cxx11::string::~string((string *)(tmp.field_2._M_local_buf + 8));
    case NEW:
      bVar2 = true;
    }
    if (bVar2) {
      psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
      std::__cxx11::string::string(local_268,(string *)psVar5);
      std::__cxx11::string::operator+=(local_268,"/");
      std::__cxx11::string::operator+=(local_268,(string *)local_40);
      std::__cxx11::string::operator=((string *)local_40,local_268);
      std::__cxx11::string::~string(local_268);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)unixPath.field_2._8_8_,(value_type *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void cmLinkDirectoriesCommand::AddLinkDir(
  std::string const& dir, std::vector<std::string>& directories)
{
  std::string unixPath = dir;
  cmSystemTools::ConvertToUnixSlashes(unixPath);
  if (!cmSystemTools::FileIsFullPath(unixPath) &&
      !cmGeneratorExpression::StartsWithGeneratorExpression(unixPath)) {
    bool convertToAbsolute = false;
    std::ostringstream e;
    /* clang-format off */
    e << "This command specifies the relative path\n"
      << "  " << unixPath << "\n"
      << "as a link directory.\n";
    /* clang-format on */
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0015)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0015);
        this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
        break;
      case cmPolicies::OLD:
        // OLD behavior does not convert
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        e << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0015);
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior converts
        convertToAbsolute = true;
        break;
    }
    if (convertToAbsolute) {
      std::string tmp = this->Makefile->GetCurrentSourceDirectory();
      tmp += "/";
      tmp += unixPath;
      unixPath = tmp;
    }
  }
  directories.push_back(unixPath);
}